

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

void glob_cleanup(URLGlob **globp)

{
  URLGlob *__ptr;
  long lVar1;
  char **__ptr_00;
  ulong uVar2;
  ulong uVar3;
  
  __ptr = *globp;
  if (__ptr != (URLGlob *)0x0) {
    uVar2 = __ptr->size;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        if (__ptr->pattern[uVar3].type == UPTSet) {
          __ptr_00 = __ptr->pattern[uVar3].content.Set.elements;
          if (__ptr_00 != (char **)0x0) {
            lVar1 = __ptr->pattern[uVar3].content.Set.size;
            if (0 < lVar1) {
              uVar2 = lVar1 + 1;
              do {
                free(*(void **)(__ptr->pattern[uVar3].content.NumRange.min_n + -0x10 + uVar2 * 8));
                *(undefined8 *)(__ptr->pattern[uVar3].content.NumRange.min_n + -0x10 + uVar2 * 8) =
                     0;
                uVar2 = uVar2 - 1;
              } while (1 < uVar2);
              __ptr_00 = __ptr->pattern[uVar3].content.Set.elements;
            }
            free(__ptr_00);
            __ptr->pattern[uVar3].content.Set.elements = (char **)0x0;
            uVar2 = __ptr->size;
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    free(__ptr->glob_buffer);
    free(__ptr);
    *globp = (URLGlob *)0x0;
  }
  return;
}

Assistant:

void glob_cleanup(struct URLGlob **globp)
{
  size_t i;
  curl_off_t elem;
  struct URLGlob *glob = *globp;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        curlx_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      curlx_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  curlx_safefree(glob->glob_buffer);
  curlx_safefree(glob);
  *globp = NULL;
}